

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRocket_dns.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  sunrealtype *yddata;
  sunrealtype *ydata;
  int engine_on;
  sunrealtype acc;
  sunrealtype v;
  double local_50;
  
  iVar2 = *in_RDX;
  lVar3 = N_VGetArrayPointer(in_RDI);
  pdVar4 = (double *)N_VGetArrayPointer(in_RSI);
  dVar1 = *(double *)(lVar3 + 8);
  *pdVar4 = dVar1;
  if (iVar2 == 0) {
    local_50 = 0.0;
  }
  else {
    local_50 = 2200.0 / (in_XMM0_Qa * -0.1 + 11.0);
  }
  pdVar4[1] = (dVar1 * -0.3 + local_50) - 32.0;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype v, acc;
  sunbooleantype engine_on;
  sunrealtype *ydata, *yddata;

  engine_on = *((sunbooleantype*)user_data);
  ydata     = N_VGetArrayPointer(y);
  yddata    = N_VGetArrayPointer(ydot);

  v         = ydata[1];
  yddata[0] = v;

  acc = engine_on ? Force / (massr + massf0 - brate * t) : ZERO;

  yddata[1] = acc - Drag * v - grav;

  return (0);
}